

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  ulong uVar13;
  __m128i *palVar14;
  int iVar15;
  uint uVar16;
  int32_t iVar17;
  __m128i *palVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong size;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int32_t segNum;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  int iVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar48;
  undefined1 auVar47 [16];
  int iVar49;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  int iVar54;
  uint uVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  uint uVar62;
  uint uVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar23 = (ulong)(uint)s2Len;
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_1();
        }
        else {
          iVar9 = uVar4 - 1;
          uVar43 = (ulong)uVar4 + 3;
          size = uVar43 >> 2;
          uVar19 = (uint)size;
          iVar10 = iVar9 / (int)uVar19;
          iVar31 = -open;
          iVar26 = ppVar6->min;
          uVar16 = 0x80000000 - iVar26;
          if (iVar26 != iVar31 && SBORROW4(iVar26,iVar31) == iVar26 + open < 0) {
            uVar16 = open | 0x80000000;
          }
          uVar11 = 0x7ffffffe - ppVar6->max;
          ppVar12 = parasail_result_new_table1((uint)uVar43 & 0x7ffffffc,s2Len);
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x4420402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            uVar13 = 0;
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar15 = s2Len + -1;
              iVar20 = 3 - iVar10;
              uVar16 = uVar16 + 1;
              auVar33._4_4_ = uVar16;
              auVar33._0_4_ = uVar16;
              auVar33._8_4_ = uVar16;
              auVar33._12_4_ = uVar16;
              iVar21 = -(uVar19 * gap);
              iVar26 = iVar31;
              do {
                lVar28 = 0;
                iVar27 = iVar26;
                do {
                  iVar42 = 0;
                  if (s1_beg == 0) {
                    iVar42 = iVar27;
                  }
                  *(int *)((long)&local_48 + lVar28 * 4) = iVar42;
                  lVar29 = (long)iVar42 - (ulong)(uint)open;
                  if (lVar29 < -0x7fffffff) {
                    lVar29 = -0x80000000;
                  }
                  *(int *)((long)&local_58 + lVar28 * 4) = (int)lVar29;
                  lVar28 = lVar28 + 1;
                  iVar27 = iVar27 - uVar19 * gap;
                } while (lVar28 != 4);
                ptr_02[uVar13][0] = local_48;
                ptr_02[uVar13][1] = lStack_40;
                ptr[uVar13][0] = local_58;
                ptr[uVar13][1] = lStack_50;
                uVar13 = uVar13 + 1;
                iVar26 = iVar26 - gap;
              } while (uVar13 != size);
              *ptr_00 = 0;
              uVar13 = 1;
              do {
                iVar17 = 0;
                if (s2_beg == 0) {
                  iVar17 = iVar31;
                }
                ptr_00[uVar13] = iVar17;
                uVar13 = uVar13 + 1;
                iVar31 = iVar31 - gap;
              } while (s2Len + 1 != uVar13);
              iVar26 = -open;
              iVar31 = -open;
              iVar27 = -open;
              iVar42 = -open;
              palVar18 = ptr_03 + (uVar19 - 1);
              uVar13 = size;
              uVar35 = uVar11;
              uVar36 = uVar11;
              uVar37 = uVar11;
              uVar38 = uVar11;
              do {
                *(int *)*palVar18 = iVar26;
                *(int *)((long)*palVar18 + 4) = iVar31;
                *(int *)(*palVar18 + 1) = iVar27;
                *(int *)((long)*palVar18 + 0xc) = iVar42;
                iVar26 = iVar26 - gap;
                iVar31 = iVar31 - gap;
                iVar27 = iVar27 - gap;
                iVar42 = iVar42 - gap;
                uVar35 = (uint)(iVar26 < (int)uVar35) * iVar26 | (iVar26 >= (int)uVar35) * uVar35;
                uVar36 = (uint)(iVar31 < (int)uVar36) * iVar31 | (iVar31 >= (int)uVar36) * uVar36;
                uVar37 = (uint)(iVar27 < (int)uVar37) * iVar27 | (iVar27 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar42 < (int)uVar38) * iVar42 | (iVar42 >= (int)uVar38) * uVar38;
                palVar18 = palVar18 + -1;
                iVar53 = (int)uVar13;
                uVar22 = iVar53 - 1;
                uVar13 = (ulong)uVar22;
              } while (uVar22 != 0 && 0 < iVar53);
              palVar18 = ptr_02 + (uVar19 - 1);
              palVar14 = ptr_02 + (uint)(iVar9 % (int)uVar19);
              uVar13 = 1;
              if (1 < s2Len) {
                uVar13 = uVar23;
              }
              lVar30 = (ulong)(uVar19 + (uVar19 == 0)) << 4;
              lVar29 = size * uVar23;
              lVar28 = 0;
              uVar32 = 0;
              auVar40 = auVar33;
              auVar44 = auVar33;
              iVar26 = iVar15;
              do {
                iVar31 = ppVar6->mapper[(byte)s2[uVar32]];
                uVar22 = uVar16 - (int)(*ptr_03)[0];
                uVar55 = uVar16 - *(int *)((long)*ptr_03 + 4);
                uVar57 = uVar16 - (int)(*ptr_03)[1];
                auVar47._0_4_ = uVar16 - *(int *)((long)*ptr_03 + 0xc);
                lVar24 = 0;
                auVar39 = auVar33;
                iVar17 = ptr_00[uVar32];
                iVar27 = (int)(*palVar18)[0];
                iVar42 = *(int *)((long)*palVar18 + 4);
                iVar53 = (int)(*palVar18)[1];
                do {
                  piVar7 = (int *)((long)*ptr_02 + lVar24);
                  iVar60 = *piVar7;
                  iVar51 = piVar7[1];
                  iVar52 = piVar7[2];
                  iVar48 = piVar7[3];
                  piVar7 = (int *)((long)*ptr + lVar24);
                  piVar2 = (int *)((long)pvVar5 + lVar24 + (long)iVar31 * size * 0x10);
                  iVar49 = iVar17 + *piVar2;
                  iVar27 = iVar27 + piVar2[1];
                  iVar42 = iVar42 + piVar2[2];
                  iVar53 = iVar53 + piVar2[3];
                  piVar2 = (int *)((long)*ptr_03 + lVar24);
                  iVar54 = uVar22 + *piVar2;
                  iVar56 = uVar55 + piVar2[1];
                  iVar58 = uVar57 + piVar2[2];
                  iVar59 = auVar47._0_4_ + piVar2[3];
                  iVar64 = *piVar7 - gap;
                  iVar65 = piVar7[1] - gap;
                  iVar66 = piVar7[2] - gap;
                  iVar67 = piVar7[3] - gap;
                  iVar61 = auVar39._0_4_;
                  auVar46._0_4_ =
                       (uint)(iVar61 < iVar54) * iVar54 | (uint)(iVar61 >= iVar54) * iVar61;
                  iVar61 = auVar39._4_4_;
                  auVar46._4_4_ =
                       (uint)(iVar61 < iVar56) * iVar56 | (uint)(iVar61 >= iVar56) * iVar61;
                  iVar61 = auVar39._8_4_;
                  iVar54 = auVar39._12_4_;
                  auVar46._8_4_ =
                       (uint)(iVar61 < iVar58) * iVar58 | (uint)(iVar61 >= iVar58) * iVar61;
                  auVar46._12_4_ =
                       (uint)(iVar54 < iVar59) * iVar59 | (uint)(iVar54 >= iVar59) * iVar54;
                  iVar61 = iVar60 - open;
                  iVar54 = iVar51 - open;
                  iVar56 = iVar52 - open;
                  iVar58 = iVar48 - open;
                  auVar47._4_4_ =
                       (uint)(iVar61 < iVar64) * iVar64 | (uint)(iVar61 >= iVar64) * iVar61;
                  auVar47._8_4_ =
                       (uint)(iVar54 < iVar65) * iVar65 | (uint)(iVar54 >= iVar65) * iVar54;
                  uVar62 = (uint)(iVar56 < iVar66) * iVar66 | (uint)(iVar56 >= iVar66) * iVar56;
                  uVar63 = (uint)(iVar58 < iVar67) * iVar67 | (uint)(iVar58 >= iVar67) * iVar58;
                  uVar22 = (iVar49 < (int)auVar47._4_4_) * auVar47._4_4_ |
                           (uint)(iVar49 >= (int)auVar47._4_4_) * iVar49;
                  uVar55 = (iVar27 < (int)auVar47._8_4_) * auVar47._8_4_ |
                           (uint)(iVar27 >= (int)auVar47._8_4_) * iVar27;
                  uVar57 = (iVar42 < (int)uVar62) * uVar62 | (uint)(iVar42 >= (int)uVar62) * iVar42;
                  auVar47._0_4_ =
                       (iVar53 < (int)uVar63) * uVar63 | (uint)(iVar53 >= (int)uVar63) * iVar53;
                  puVar3 = (uint *)((long)*ptr + lVar24);
                  *puVar3 = auVar47._4_4_;
                  puVar3[1] = auVar47._8_4_;
                  puVar3[2] = uVar62;
                  puVar3[3] = uVar63;
                  puVar3 = (uint *)((long)*ptr_01 + lVar24);
                  *puVar3 = uVar22;
                  puVar3[1] = uVar55;
                  puVar3[2] = uVar57;
                  puVar3[3] = auVar47._0_4_;
                  lVar24 = lVar24 + 0x10;
                  auVar39 = auVar46;
                  iVar17 = iVar60;
                  iVar27 = iVar51;
                  iVar42 = iVar52;
                  iVar53 = iVar48;
                } while (lVar30 != lVar24);
                uVar1 = uVar32 + 1;
                iVar31 = ptr_00[uVar32 + 1];
                iVar27 = (int)(*ptr_03)[0] + iVar31;
                iVar42 = *(int *)((long)*ptr_03 + 4) + uVar22;
                iVar53 = (int)(*ptr_03)[1] + uVar55;
                iVar60 = *(int *)((long)*ptr_03 + 0xc) + uVar57;
                auVar39._0_4_ =
                     (uint)((int)auVar46._0_4_ < iVar27) * iVar27 |
                     ((int)auVar46._0_4_ >= iVar27) * auVar46._0_4_;
                auVar39._4_4_ =
                     (uint)((int)auVar46._4_4_ < iVar42) * iVar42 |
                     ((int)auVar46._4_4_ >= iVar42) * auVar46._4_4_;
                auVar39._8_4_ =
                     (uint)((int)auVar46._8_4_ < iVar53) * iVar53 |
                     ((int)auVar46._8_4_ >= iVar53) * auVar46._8_4_;
                auVar39._12_4_ =
                     (uint)((int)auVar46._12_4_ < iVar60) * iVar60 |
                     ((int)auVar46._12_4_ >= iVar60) * auVar46._12_4_;
                iVar27 = 1;
                do {
                  iVar53 = auVar39._0_4_;
                  iVar42 = iVar53 + iVar21;
                  iVar51 = auVar39._4_4_;
                  iVar52 = auVar39._8_4_;
                  iVar60 = iVar51 + iVar21;
                  iVar48 = iVar52 + iVar21;
                  auVar47._0_4_ =
                       (uint)((int)uVar16 < iVar53) * iVar53 | ((int)uVar16 >= iVar53) * uVar16;
                  auVar47._4_4_ =
                       (uint)(iVar42 < iVar51) * iVar51 | (uint)(iVar42 >= iVar51) * iVar42;
                  auVar47._8_4_ =
                       (uint)(iVar60 < iVar52) * iVar52 | (uint)(iVar60 >= iVar52) * iVar60;
                  iVar42 = auVar39._12_4_;
                  auVar47._12_4_ =
                       (uint)(iVar48 < iVar42) * iVar42 | (uint)(iVar48 >= iVar42) * iVar48;
                  iVar27 = iVar27 + -1;
                  auVar39 = auVar47;
                } while (iVar27 == 0);
                uVar62 = (iVar31 < (int)uVar16) * uVar16 | (uint)(iVar31 >= (int)uVar16) * iVar31;
                uVar63 = ((int)uVar22 < (int)auVar47._0_4_) * auVar47._0_4_ |
                         ((int)uVar22 >= (int)auVar47._0_4_) * uVar22;
                uVar55 = ((int)uVar55 < (int)auVar47._4_4_) * auVar47._4_4_ |
                         ((int)uVar55 >= (int)auVar47._4_4_) * uVar55;
                uVar57 = ((int)uVar57 < (int)auVar47._8_4_) * auVar47._8_4_ |
                         ((int)uVar57 >= (int)auVar47._8_4_) * uVar57;
                lVar25 = 0;
                lVar24 = lVar28;
                auVar39 = auVar40;
                uVar22 = uVar16;
                do {
                  iVar31 = uVar22 - gap;
                  iVar27 = auVar47._0_4_ - gap;
                  iVar42 = auVar47._4_4_ - gap;
                  iVar53 = auVar47._8_4_ - gap;
                  iVar60 = uVar62 - open;
                  iVar51 = uVar63 - open;
                  iVar52 = uVar55 - open;
                  iVar48 = uVar57 - open;
                  uVar22 = (uint)(iVar31 < iVar60) * iVar60 | (uint)(iVar31 >= iVar60) * iVar31;
                  auVar47._0_4_ =
                       (uint)(iVar27 < iVar51) * iVar51 | (uint)(iVar27 >= iVar51) * iVar27;
                  auVar47._4_4_ =
                       (uint)(iVar42 < iVar52) * iVar52 | (uint)(iVar42 >= iVar52) * iVar42;
                  auVar47._8_4_ =
                       (uint)(iVar53 < iVar48) * iVar48 | (uint)(iVar53 >= iVar48) * iVar53;
                  piVar7 = (int *)((long)*ptr_01 + lVar25);
                  iVar31 = *piVar7;
                  iVar27 = piVar7[1];
                  iVar42 = piVar7[2];
                  iVar53 = piVar7[3];
                  uVar62 = (iVar31 < (int)uVar22) * uVar22 | (uint)(iVar31 >= (int)uVar22) * iVar31;
                  uVar63 = (iVar27 < (int)auVar47._0_4_) * auVar47._0_4_ |
                           (uint)(iVar27 >= (int)auVar47._0_4_) * iVar27;
                  uVar55 = (iVar42 < (int)auVar47._4_4_) * auVar47._4_4_ |
                           (uint)(iVar42 >= (int)auVar47._4_4_) * iVar42;
                  uVar57 = (iVar53 < (int)auVar47._8_4_) * auVar47._8_4_ |
                           (uint)(iVar53 >= (int)auVar47._8_4_) * iVar53;
                  puVar3 = (uint *)((long)*ptr_02 + lVar25);
                  *puVar3 = uVar62;
                  puVar3[1] = uVar63;
                  puVar3[2] = uVar55;
                  puVar3[3] = uVar57;
                  uVar35 = ((int)uVar22 < (int)uVar35) * uVar22 |
                           ((int)uVar22 >= (int)uVar35) * uVar35;
                  uVar36 = ((int)auVar47._0_4_ < (int)uVar36) * auVar47._0_4_ |
                           ((int)auVar47._0_4_ >= (int)uVar36) * uVar36;
                  uVar37 = ((int)auVar47._4_4_ < (int)uVar37) * auVar47._4_4_ |
                           ((int)auVar47._4_4_ >= (int)uVar37) * uVar37;
                  uVar38 = ((int)auVar47._8_4_ < (int)uVar38) * auVar47._8_4_ |
                           ((int)auVar47._8_4_ >= (int)uVar38) * uVar38;
                  uVar35 = ((int)uVar62 < (int)uVar35) * uVar62 |
                           ((int)uVar62 >= (int)uVar35) * uVar35;
                  uVar36 = ((int)uVar63 < (int)uVar36) * uVar63 |
                           ((int)uVar63 >= (int)uVar36) * uVar36;
                  uVar37 = ((int)uVar55 < (int)uVar37) * uVar55 |
                           ((int)uVar55 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar57 < (int)uVar38) * uVar57 |
                           ((int)uVar57 >= (int)uVar38) * uVar38;
                  piVar7 = ((ppVar12->field_4).rowcols)->score_row;
                  *(uint *)((long)piVar7 + lVar24) = uVar62;
                  *(uint *)((long)piVar7 + lVar29 * 4 + lVar24) = uVar63;
                  *(uint *)((long)piVar7 + lVar29 * 8 + lVar24) = uVar55;
                  *(uint *)((long)piVar7 + lVar29 * 0xc + lVar24) = uVar57;
                  iVar31 = auVar39._0_4_;
                  auVar40._0_4_ =
                       (iVar31 < (int)uVar62) * uVar62 | (uint)(iVar31 >= (int)uVar62) * iVar31;
                  iVar31 = auVar39._4_4_;
                  auVar40._4_4_ =
                       (iVar31 < (int)uVar63) * uVar63 | (uint)(iVar31 >= (int)uVar63) * iVar31;
                  iVar31 = auVar39._8_4_;
                  iVar27 = auVar39._12_4_;
                  auVar40._8_4_ =
                       (iVar31 < (int)uVar55) * uVar55 | (uint)(iVar31 >= (int)uVar55) * iVar31;
                  auVar40._12_4_ =
                       (iVar27 < (int)uVar57) * uVar57 | (uint)(iVar27 >= (int)uVar57) * iVar27;
                  lVar25 = lVar25 + 0x10;
                  lVar24 = lVar24 + uVar23 * 4;
                  auVar39 = auVar40;
                } while (lVar30 != lVar25);
                iVar31 = (int)(*palVar14)[0];
                iVar27 = *(int *)((long)*palVar14 + 4);
                iVar42 = (int)(*palVar14)[1];
                iVar53 = *(int *)((long)*palVar14 + 0xc);
                iVar51 = auVar44._0_4_;
                auVar50._0_4_ = -(uint)(iVar51 < iVar31);
                iVar52 = auVar44._4_4_;
                auVar50._4_4_ = -(uint)(iVar52 < iVar27);
                iVar48 = auVar44._8_4_;
                auVar50._8_4_ = -(uint)(iVar48 < iVar42);
                iVar61 = auVar44._12_4_;
                auVar50._12_4_ = -(uint)(iVar61 < iVar53);
                auVar8._4_4_ = -(uint)(iVar20 == 2);
                auVar8._0_4_ = -(uint)(iVar20 == 3);
                auVar8._8_4_ = -(uint)(iVar20 == 1);
                auVar8._12_4_ = -(uint)(iVar20 == 0);
                iVar60 = movmskps((int)palVar14,auVar50 & auVar8);
                if (iVar60 != 0) {
                  iVar26 = (int)uVar32;
                }
                auVar44._0_4_ = (uint)(iVar51 < iVar31) * iVar31 | (uint)(iVar51 >= iVar31) * iVar51
                ;
                auVar44._4_4_ = (uint)(iVar52 < iVar27) * iVar27 | (uint)(iVar52 >= iVar27) * iVar52
                ;
                auVar44._8_4_ = (uint)(iVar48 < iVar42) * iVar42 | (uint)(iVar48 >= iVar42) * iVar48
                ;
                auVar44._12_4_ =
                     (uint)(iVar61 < iVar53) * iVar53 | (uint)(iVar61 >= iVar53) * iVar61;
                lVar28 = lVar28 + 4;
                uVar32 = uVar1;
              } while (uVar1 != uVar13);
              uVar22 = uVar16;
              if ((s2_end != 0) && (uVar22 = auVar44._12_4_, iVar10 < 3)) {
                iVar31 = 1;
                if (1 < iVar20) {
                  iVar31 = iVar20;
                }
                do {
                  auVar45._0_8_ = auVar44._0_8_ << 0x20;
                  auVar45._8_8_ = auVar44._8_8_ << 0x20 | auVar44._0_8_ >> 0x20;
                  uVar22 = auVar44._8_4_;
                  iVar31 = iVar31 + -1;
                  auVar44 = auVar45;
                } while (iVar31 != 0);
              }
              iVar31 = iVar9;
              if ((s1_end != 0) && ((uVar43 & 0x7ffffffc) != 0)) {
                uVar23 = 0;
                do {
                  iVar21 = ((uint)uVar23 & 3) * uVar19 + ((uint)(uVar23 >> 2) & 0x3fffffff);
                  iVar27 = iVar26;
                  uVar55 = uVar22;
                  iVar42 = iVar31;
                  if ((iVar21 < (int)uVar4) &&
                     (uVar57 = *(uint *)((long)*ptr_02 + uVar23 * 4), iVar27 = iVar15,
                     uVar55 = uVar57, iVar42 = iVar21, (int)uVar57 <= (int)uVar22)) {
                    if (iVar31 <= iVar21) {
                      iVar21 = iVar31;
                    }
                    iVar27 = iVar26;
                    uVar55 = uVar22;
                    iVar42 = iVar31;
                    if (iVar26 == iVar15 && uVar57 == uVar22) {
                      iVar42 = iVar21;
                    }
                  }
                  iVar31 = iVar42;
                  uVar22 = uVar55;
                  iVar26 = iVar27;
                  uVar23 = uVar23 + 1;
                } while ((uVar19 & 0x1fffffff) << 2 != (int)uVar23);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar23 = ptr_02[(uint)(iVar9 % (int)uVar19)][0];
                uVar43 = ptr_02[(uint)(iVar9 % (int)uVar19)][1];
                if (iVar10 < 3) {
                  iVar26 = 1;
                  if (1 < iVar20) {
                    iVar26 = iVar20;
                  }
                  do {
                    uVar43 = uVar43 << 0x20 | uVar23 >> 0x20;
                    iVar26 = iVar26 + -1;
                    uVar23 = uVar23 << 0x20;
                  } while (iVar26 != 0);
                }
                uVar22 = (uint)(uVar43 >> 0x20);
                iVar26 = iVar15;
                iVar31 = iVar9;
                s1_end = iVar9;
              }
              auVar34._0_4_ = -(uint)((int)uVar35 < (int)uVar16);
              auVar34._4_4_ = -(uint)((int)uVar36 < (int)uVar16);
              auVar34._8_4_ = -(uint)((int)uVar37 < (int)uVar16);
              auVar34._12_4_ = -(uint)((int)uVar38 < (int)uVar16);
              auVar41._0_4_ = -(uint)((int)uVar11 < (int)auVar40._0_4_);
              auVar41._4_4_ = -(uint)((int)uVar11 < (int)auVar40._4_4_);
              auVar41._8_4_ = -(uint)((int)uVar11 < (int)auVar40._8_4_);
              auVar41._12_4_ = -(uint)((int)uVar11 < (int)auVar40._12_4_);
              iVar9 = movmskps(s1_end,auVar41 | auVar34);
              if (iVar9 != 0) {
                *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                uVar22 = 0;
                iVar26 = 0;
                iVar31 = 0;
              }
              ppVar12->score = uVar22;
              ppVar12->end_query = iVar31;
              ppVar12->end_ref = iVar26;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar12;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}